

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int archive_read_format_iso9660_bid(archive_read *a,int best_bid)

{
  uchar *__s1;
  vd *pvVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  iso9660 *iso9660;
  long lVar6;
  char cVar7;
  int iVar8;
  void *pvVar9;
  vd *pvVar10;
  uint uVar11;
  uint32_t *puVar12;
  uint64_t uVar13;
  long lVar14;
  byte *h;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ssize_t bytes_read;
  long local_58;
  ulong local_50;
  long local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  iVar8 = -1;
  if (best_bid < 0x31) {
    iso9660 = (iso9660 *)a->format->data;
    pvVar9 = __archive_read_ahead(a,0xc000,&local_58);
    if (pvVar9 != (void *)0x0) {
      if (0x8800 < local_58) {
        h = (byte *)((long)pvVar9 + 0x8000);
        __s1 = iso9660->null;
        pvVar1 = &iso9660->primary;
        local_40 = &(iso9660->primary).size;
        local_38 = &(iso9660->joliet).size;
        lVar6 = local_58 + -0x8800;
        local_58 = local_58 + -0x8000;
        do {
          lVar14 = lVar6;
          bVar2 = *h;
          if ((3 < bVar2) && (bVar2 != 0xff)) {
            return 0;
          }
          if (h[5] != 0x31 || *(int *)(h + 1) != 0x30304443) {
            return 0;
          }
          if ((((bVar2 == 1) && (h[6] == 1)) && (h[7] == 0)) &&
             (((*(long *)__s1 == *(long *)(h + 0x48) &&
               (auVar17[0] = -(h[0x58] == *__s1), auVar17[1] = -(h[0x59] == iso9660->null[1]),
               auVar17[2] = -(h[0x5a] == iso9660->null[2]),
               auVar17[3] = -(h[0x5b] == iso9660->null[3]),
               auVar17[4] = -(h[0x5c] == iso9660->null[4]),
               auVar17[5] = -(h[0x5d] == iso9660->null[5]),
               auVar17[6] = -(h[0x5e] == iso9660->null[6]),
               auVar17[7] = -(h[0x5f] == iso9660->null[7]),
               auVar17[8] = -(h[0x60] == iso9660->null[8]),
               auVar17[9] = -(h[0x61] == iso9660->null[9]),
               auVar17[10] = -(h[0x62] == iso9660->null[10]),
               auVar17[0xb] = -(h[99] == iso9660->null[0xb]),
               auVar17[0xc] = -(h[100] == iso9660->null[0xc]),
               auVar17[0xd] = -(h[0x65] == iso9660->null[0xd]),
               auVar17[0xe] = -(h[0x66] == iso9660->null[0xe]),
               auVar17[0xf] = -(h[0x67] == iso9660->null[0xf]),
               auVar15[0] = -(h[0x68] == iso9660->null[0x10]),
               auVar15[1] = -(h[0x69] == iso9660->null[0x11]),
               auVar15[2] = -(h[0x6a] == iso9660->null[0x12]),
               auVar15[3] = -(h[0x6b] == iso9660->null[0x13]),
               auVar15[4] = -(h[0x6c] == iso9660->null[0x14]),
               auVar15[5] = -(h[0x6d] == iso9660->null[0x15]),
               auVar15[6] = -(h[0x6e] == iso9660->null[0x16]),
               auVar15[7] = -(h[0x6f] == iso9660->null[0x17]),
               auVar15[8] = -(h[0x70] == iso9660->null[0x18]),
               auVar15[9] = -(h[0x71] == iso9660->null[0x19]),
               auVar15[10] = -(h[0x72] == iso9660->null[0x1a]),
               auVar15[0xb] = -(h[0x73] == iso9660->null[0x1b]),
               auVar15[0xc] = -(h[0x74] == iso9660->null[0x1c]),
               auVar15[0xd] = -(h[0x75] == iso9660->null[0x1d]),
               auVar15[0xe] = -(h[0x76] == iso9660->null[0x1e]),
               auVar15[0xf] = -(h[0x77] == iso9660->null[0x1f]), auVar15 = auVar15 & auVar17,
               (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff)) &&
              ((ulong)*(ushort *)(h + 0x80) != 0)))) {
            iVar8 = *(int *)(h + 0x50);
            if ((((long)iVar8 < 0x15) || (h[0x371] != 1)) ||
               ((iVar8 <= *(int *)(h + 0x8c) || *(int *)(h + 0x8c) < 0x12 ||
                ((((uVar11 = *(uint *)(h + 0x94),
                   uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                            uVar11 << 0x18, iVar8 <= (int)uVar11 || 0xffffffee < uVar11 - 0x12 ||
                   ((h[0x372] & 0xdf) != 0)) ||
                  (local_50 = (ulong)*(ushort *)(h + 0x80), local_48 = (long)iVar8,
                  iVar8 = bcmp(__s1,h + 0x573,0x28d), iVar8 != 0)) || (h[0x9c] != 0x22))))))
            goto LAB_003b410c;
            if (pvVar1->location != 0) goto LAB_003b4217;
            iso9660->logical_block_size = local_50;
            iso9660->volume_block = (int32_t)local_48;
            uVar13 = local_48 * local_50;
            pvVar10 = pvVar1;
            puVar12 = local_40;
LAB_003b4271:
            iso9660->volume_size = uVar13;
            pvVar10->location = *(int *)(h + 0x9e);
            *puVar12 = *(uint32_t *)(h + 0xa6);
          }
          else {
LAB_003b410c:
            if ((((iso9660->joliet).location == 0) && (iVar8 = isSVD(iso9660,h), iVar8 != 0)) &&
               ((h[0x58] == 0x25 && (h[0x59] == 0x2f)))) {
              bVar3 = h[0x5a];
              if (bVar3 == 0x40) {
                cVar7 = '\x01';
              }
              else if (bVar3 == 0x45) {
                cVar7 = '\x03';
              }
              else {
                if (bVar3 != 0x43) goto LAB_003b4113;
                cVar7 = '\x02';
              }
              iso9660->seenJoliet = cVar7;
              uVar4 = *(ushort *)(h + 0x80);
              iVar8 = *(int *)(h + 0x50);
              iso9660->logical_block_size = (ulong)uVar4;
              iso9660->volume_block = iVar8;
              uVar13 = (ulong)uVar4 * (long)iVar8;
              pvVar10 = &iso9660->joliet;
              puVar12 = local_38;
              goto LAB_003b4271;
            }
LAB_003b4113:
            if (bVar2 == 2) {
              if ((((((h[6] != 2) || (h[7] != 0)) ||
                    ((*(long *)__s1 != *(long *)(h + 0x48) ||
                     (((auVar18[0] = -(h[0x58] == *__s1),
                       auVar18[1] = -(h[0x59] == iso9660->null[1]),
                       auVar18[2] = -(h[0x5a] == iso9660->null[2]),
                       auVar18[3] = -(h[0x5b] == iso9660->null[3]),
                       auVar18[4] = -(h[0x5c] == iso9660->null[4]),
                       auVar18[5] = -(h[0x5d] == iso9660->null[5]),
                       auVar18[6] = -(h[0x5e] == iso9660->null[6]),
                       auVar18[7] = -(h[0x5f] == iso9660->null[7]),
                       auVar18[8] = -(h[0x60] == iso9660->null[8]),
                       auVar18[9] = -(h[0x61] == iso9660->null[9]),
                       auVar18[10] = -(h[0x62] == iso9660->null[10]),
                       auVar18[0xb] = -(h[99] == iso9660->null[0xb]),
                       auVar18[0xc] = -(h[100] == iso9660->null[0xc]),
                       auVar18[0xd] = -(h[0x65] == iso9660->null[0xd]),
                       auVar18[0xe] = -(h[0x66] == iso9660->null[0xe]),
                       auVar18[0xf] = -(h[0x67] == iso9660->null[0xf]),
                       auVar16[0] = -(h[0x68] == iso9660->null[0x10]),
                       auVar16[1] = -(h[0x69] == iso9660->null[0x11]),
                       auVar16[2] = -(h[0x6a] == iso9660->null[0x12]),
                       auVar16[3] = -(h[0x6b] == iso9660->null[0x13]),
                       auVar16[4] = -(h[0x6c] == iso9660->null[0x14]),
                       auVar16[5] = -(h[0x6d] == iso9660->null[0x15]),
                       auVar16[6] = -(h[0x6e] == iso9660->null[0x16]),
                       auVar16[7] = -(h[0x6f] == iso9660->null[0x17]),
                       auVar16[8] = -(h[0x70] == iso9660->null[0x18]),
                       auVar16[9] = -(h[0x71] == iso9660->null[0x19]),
                       auVar16[10] = -(h[0x72] == iso9660->null[0x1a]),
                       auVar16[0xb] = -(h[0x73] == iso9660->null[0x1b]),
                       auVar16[0xc] = -(h[0x74] == iso9660->null[0x1c]),
                       auVar16[0xd] = -(h[0x75] == iso9660->null[0x1d]),
                       auVar16[0xe] = -(h[0x76] == iso9660->null[0x1e]),
                       auVar16[0xf] = -(h[0x77] == iso9660->null[0x1f]), auVar16 = auVar16 & auVar18
                       , (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff ||
                       (*(short *)(h + 0x80) == 0)) || (iVar8 = *(int *)(h + 0x50), iVar8 < 0x15))))
                    )) || ((h[0x371] != 2 ||
                           (iVar8 <= *(int *)(h + 0x8c) || *(int *)(h + 0x8c) < 0x12)))) ||
                  (uVar11 = *(uint *)(h + 0x94),
                  uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                           uVar11 << 0x18, iVar8 <= (int)uVar11 || 0xffffffee < uVar11 - 0x12)) ||
                 (((*__s1 != h[0x372] || (iVar8 = bcmp(__s1,h + 0x573,0x28d), iVar8 != 0)) ||
                  (h[0x9c] != 0x22)))) goto LAB_003b41c1;
            }
            else if ((bVar2 != 0) || (h[6] != 1)) {
LAB_003b41c1:
              iVar8 = isSVD(iso9660,h);
              if ((iVar8 == 0) &&
                 ((((bVar2 != 3 || (h[6] != 1)) || (h[7] != 0)) ||
                  (((uVar11 = *(uint *)(h + 0x48), (int)uVar11 < 0x11 ||
                    (iso9660->volume_block <= (int)uVar11)) ||
                   (uVar5 = *(uint *)(h + 0x4c),
                   uVar11 != (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                             uVar5 << 0x18))))))) {
                iVar8 = isVDSetTerminator(iso9660,h);
                if (iVar8 == 0) {
                  return 0;
                }
                if (0x10 < pvVar1->location) {
                  return 0x30;
                }
                break;
              }
            }
          }
LAB_003b4217:
          h = h + 0x800;
          lVar6 = lVar14 + -0x800;
          local_58 = lVar14;
        } while (0x1000 < lVar14 + 0x800);
      }
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

static int
archive_read_format_iso9660_bid(struct archive_read *a, int best_bid)
{
	struct iso9660 *iso9660;
	ssize_t bytes_read;
	const unsigned char *p;
	int seenTerminator;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 48)
		return (-1);

	iso9660 = (struct iso9660 *)(a->format->data);

	/*
	 * Skip the first 32k (reserved area) and get the first
	 * 8 sectors of the volume descriptor table.  Of course,
	 * if the I/O layer gives us more, we'll take it.
	 */
#define RESERVED_AREA	(SYSTEM_AREA_BLOCK * LOGICAL_BLOCK_SIZE)
	p = __archive_read_ahead(a,
	    RESERVED_AREA + 8 * LOGICAL_BLOCK_SIZE,
	    &bytes_read);
	if (p == NULL)
	    return (-1);

	/* Skip the reserved area. */
	bytes_read -= RESERVED_AREA;
	p += RESERVED_AREA;

	/* Check each volume descriptor. */
	seenTerminator = 0;
	for (; bytes_read > LOGICAL_BLOCK_SIZE;
	    bytes_read -= LOGICAL_BLOCK_SIZE, p += LOGICAL_BLOCK_SIZE) {
		/* Do not handle undefined Volume Descriptor Type. */
		if (p[0] >= 4 && p[0] <= 254)
			return (0);
		/* Standard Identifier must be "CD001" */
		if (memcmp(p + 1, "CD001", 5) != 0)
			return (0);
		if (isPVD(iso9660, p))
			continue;
		if (!iso9660->joliet.location) {
			if (isJolietSVD(iso9660, p))
				continue;
		}
		if (isBootRecord(iso9660, p))
			continue;
		if (isEVD(iso9660, p))
			continue;
		if (isSVD(iso9660, p))
			continue;
		if (isVolumePartition(iso9660, p))
			continue;
		if (isVDSetTerminator(iso9660, p)) {
			seenTerminator = 1;
			break;
		}
		return (0);
	}
	/*
	 * ISO 9660 format must have Primary Volume Descriptor and
	 * Volume Descriptor Set Terminator.
	 */
	if (seenTerminator && iso9660->primary.location > 16)
		return (48);

	/* We didn't find a valid PVD; return a bid of zero. */
	return (0);
}